

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::split_leaf(memory_tree *b,single_learner *base,uint32_t cn)

{
  v_array<memory_tree_ns::node> *this;
  uint64_t *puVar1;
  polyprediction *ppVar2;
  node *pnVar3;
  size_t sVar4;
  double *pdVar5;
  ostream *poVar6;
  ulong uVar7;
  uint32_t uVar8;
  example *peVar9;
  long lVar10;
  long lVar11;
  uint *__ptr;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  uint32_t ec_pos;
  labels preds;
  labels multilabels;
  uint local_ec;
  undefined8 local_e8;
  label_t local_e0;
  long local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  v_array<memory_tree_ns::node> *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  float *local_98;
  float *pfStack_90;
  float *local_88;
  size_t sStack_80;
  label_t local_78;
  wclass *pwStack_70;
  wclass *local_68;
  double dStack_60;
  double dStack_58;
  uint *local_50;
  uint *puStack_48;
  uint *local_40;
  size_t sStack_38;
  
  this = &b->nodes;
  local_e0.label = cn;
  uVar7 = (ulong)cn;
  (b->nodes)._begin[uVar7].internal = 1;
  uVar13 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * -0x71c71c71c71c71c7;
  local_68 = (wclass *)0x0;
  local_78.label = 0;
  local_78.weight = 0.0;
  pwStack_70 = (wclass *)0x0;
  dStack_60 = 0.001;
  dStack_58 = 0.001;
  local_50 = (uint *)0x0;
  puStack_48 = (uint *)0x0;
  local_40 = (uint *)0x0;
  sStack_38 = 0;
  local_e8 = uVar7;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&local_78);
  local_a0 = uVar13 & 0xffffffff;
  local_c8 = local_a0 * 0x48;
  (b->nodes)._begin[local_a0].internal = -1;
  pnVar3 = (b->nodes)._begin;
  sVar4 = b->routers_used;
  b->routers_used = sVar4 + 1;
  pnVar3[local_a0].base_router = (uint32_t)sVar4;
  uVar14 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * -0x71c71c71c71c71c7;
  local_68 = (wclass *)0x0;
  local_78.label = 0;
  local_78.weight = 0.0;
  pwStack_70 = (wclass *)0x0;
  dStack_60 = 0.001;
  dStack_58 = 0.001;
  local_50 = (uint *)0x0;
  puStack_48 = (uint *)0x0;
  local_40 = (uint *)0x0;
  sStack_38 = 0;
  local_c0 = uVar13;
  local_b8 = this;
  v_array<memory_tree_ns::node>::push_back(this,(node *)&local_78);
  local_a8 = uVar14 & 0xffffffff;
  local_d8 = local_a8 * 0x48;
  (b->nodes)._begin[local_a8].internal = -1;
  pnVar3 = (b->nodes)._begin;
  sVar4 = b->routers_used;
  b->routers_used = sVar4 + 1;
  pnVar3[local_a8].base_router = (uint32_t)sVar4;
  uVar13 = (ulong)((b->nodes)._begin[uVar7].depth + 1);
  local_d0 = uVar14;
  if (b->max_depth < uVar13) {
    b->max_depth = uVar13;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"depth ",6);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  uVar13 = local_e8;
  (b->nodes)._begin[uVar7].left = (uint32_t)local_c0;
  (b->nodes)._begin[uVar7].right = (uint32_t)local_d0;
  *(uint32_t *)((long)&((b->nodes)._begin)->parent + local_c8) = local_e0.label;
  *(uint32_t *)((long)&((b->nodes)._begin)->parent + local_d8) = local_e0.label;
  pnVar3 = (b->nodes)._begin;
  *(uint32_t *)((long)&pnVar3->depth + local_c8) = pnVar3[uVar7].depth + 1;
  pnVar3 = (b->nodes)._begin;
  *(uint32_t *)((long)&pnVar3->depth + local_d8) = pnVar3[uVar7].depth + 1;
  uVar14 = (ulong)*(uint *)((long)&((b->nodes)._begin)->depth + local_c8);
  if (b->max_depth < uVar14) {
    b->max_depth = uVar14;
  }
  pnVar3 = local_b8->_begin;
  __ptr = pnVar3[local_e8].examples_index._begin;
  lVar12 = uVar7 * 0x48;
  if (pnVar3[local_e8].examples_index._end != __ptr) {
    uVar14 = 0;
    local_b0 = uVar7 * 0x48;
    do {
      local_ec = __ptr[uVar14];
      if (b->oas == 0) {
        peVar9 = (b->examples)._begin[local_ec];
        local_e0 = (peVar9->l).multi;
        local_e8 = CONCAT44(local_e8._4_4_,(peVar9->pred).multiclass);
      }
      else {
        peVar9 = (b->examples)._begin[local_ec];
        local_78 = (peVar9->l).multi;
        pwStack_70 = (peVar9->l).cs.costs._end;
        local_68 = (peVar9->l).cs.costs.end_array;
        dStack_60 = (double)(peVar9->l).cs.costs.erase_count;
        local_98 = (peVar9->pred).scalars._begin;
        pfStack_90 = (peVar9->pred).scalars._end;
        local_88 = (peVar9->pred).scalars.end_array;
        sStack_80 = (peVar9->pred).scalars.erase_count;
        local_e8 = (ulong)local_e8._4_4_ << 0x20;
      }
      peVar9 = (b->examples)._begin[local_ec];
      (peVar9->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
      (peVar9->l).simple.initial = 0.0;
      peVar9 = (b->examples)._begin[local_ec];
      uVar8 = (b->nodes)._begin[uVar13].base_router;
      puVar1 = &(peVar9->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar9);
      lVar10 = local_c8;
      lVar12 = local_d8;
      puVar1 = &(peVar9->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
      pnVar3 = (b->nodes)._begin;
      ppVar2 = &(b->examples)._begin[local_ec]->pred;
      if (0.0 < ppVar2->scalar || ppVar2->scalar == 0.0) {
        v_array<unsigned_int>::push_back
                  ((v_array<unsigned_int> *)((long)&(pnVar3->examples_index)._begin + local_d8),
                   &local_ec);
        peVar9 = (b->examples)._begin[local_ec];
        uVar8 = (uint32_t)local_d0;
      }
      else {
        v_array<unsigned_int>::push_back
                  ((v_array<unsigned_int> *)((long)&(pnVar3->examples_index)._begin + local_c8),
                   &local_ec);
        peVar9 = (b->examples)._begin[local_ec];
        uVar8 = (uint32_t)local_c0;
        lVar12 = lVar10;
      }
      fVar15 = train_node(b,base,peVar9,uVar8);
      pnVar3 = (b->nodes)._begin;
      if (0.0 <= fVar15) {
        pdVar5 = &pnVar3->nr;
      }
      else {
        pdVar5 = &pnVar3->nl;
      }
      *(double *)((long)pdVar5 + lVar12) = *(double *)((long)pdVar5 + lVar12) + 1.0;
      uVar7 = (ulong)local_ec;
      peVar9 = (b->examples)._begin[uVar7];
      if (b->oas == 0) {
        (peVar9->l).multi = local_e0;
        ((b->examples)._begin[uVar7]->pred).multiclass = (uint32_t)local_e8;
      }
      else {
        (peVar9->pred).scalars.end_array = local_88;
        (peVar9->pred).scalars.erase_count = sStack_80;
        (peVar9->pred).scalars._begin = local_98;
        (peVar9->pred).scalars._end = pfStack_90;
        peVar9 = (b->examples)._begin[uVar7];
        (peVar9->l).cs.costs.end_array = local_68;
        (peVar9->l).cs.costs.erase_count = (size_t)dStack_60;
        (peVar9->l).multi = local_78;
        (peVar9->l).cs.costs._end = pwStack_70;
      }
      uVar14 = uVar14 + 1;
      pnVar3 = local_b8->_begin;
      __ptr = pnVar3[uVar13].examples_index._begin;
      lVar12 = local_b0;
    } while (uVar14 < (ulong)((long)pnVar3[uVar13].examples_index._end - (long)__ptr >> 2));
  }
  pnVar3 = pnVar3 + uVar13;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (pnVar3->examples_index)._begin = (uint *)0x0;
  (pnVar3->examples_index)._end = (uint *)0x0;
  (pnVar3->examples_index).end_array = (uint *)0x0;
  pnVar3 = (b->nodes)._begin;
  lVar10 = (long)pnVar3[local_a0].examples_index._end - (long)pnVar3[local_a0].examples_index._begin
  ;
  lVar11 = lVar10 >> 2;
  auVar16._8_4_ = (int)(lVar10 >> 0x22);
  auVar16._0_8_ = lVar11;
  auVar16._12_4_ = 0x45300000;
  dVar17 = (auVar16._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  dVar20 = 0.001;
  if (0.001 <= dVar17) {
    dVar20 = dVar17;
  }
  *(double *)((long)&pnVar3->nl + lVar12) = dVar20;
  pnVar3 = (b->nodes)._begin;
  lVar10 = (long)pnVar3[local_a8].examples_index._end - (long)pnVar3[local_a8].examples_index._begin
  ;
  lVar11 = lVar10 >> 2;
  auVar18._8_4_ = (int)(lVar10 >> 0x22);
  auVar18._0_8_ = lVar11;
  auVar18._12_4_ = 0x45300000;
  dVar17 = (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  dVar20 = 0.001;
  if (0.001 <= dVar17) {
    dVar20 = dVar17;
  }
  *(double *)((long)&pnVar3->nr + lVar12) = dVar20;
  pnVar3 = (b->nodes)._begin;
  dVar17 = *(double *)((long)&pnVar3->nr + lVar12);
  dVar20 = *(double *)((long)&pnVar3->nl + lVar12);
  if (dVar17 <= dVar20) {
    dVar17 = dVar20;
  }
  sVar4 = b->max_ex_in_leaf;
  auVar19._8_4_ = (int)(sVar4 >> 0x20);
  auVar19._0_8_ = sVar4;
  auVar19._12_4_ = 0x45300000;
  if ((auVar19._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) < dVar17) {
    b->max_ex_in_leaf = (long)(dVar17 - 9.223372036854776e+18) & (long)dVar17 >> 0x3f | (long)dVar17
    ;
  }
  return;
}

Assistant:

void split_leaf(memory_tree& b, single_learner& base, const uint32_t cn)
    {
        //create two children
        b.nodes[cn].internal = 1; //swith to internal node.
        uint32_t left_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());
        b.nodes[left_child].internal = -1;  //left leaf
        b.nodes[left_child].base_router = (b.routers_used++);
        uint32_t right_child = (uint32_t)b.nodes.size();
        b.nodes.push_back(node());  
        b.nodes[right_child].internal = -1;  //right leaf
        b.nodes[right_child].base_router = (b.routers_used++); 

        if (b.nodes[cn].depth + 1 > b.max_depth){
            b.max_depth = b.nodes[cn].depth + 1;
            cout<<"depth "<<b.max_depth<<endl;
        }

        b.nodes[cn].left = left_child;
        b.nodes[cn].right = right_child;
        b.nodes[left_child].parent = cn;
        b.nodes[right_child].parent = cn;
        b.nodes[left_child].depth = b.nodes[cn].depth + 1;
        b.nodes[right_child].depth = b.nodes[cn].depth + 1;

        if (b.nodes[left_child].depth > b.max_depth)
            b.max_depth = b.nodes[left_child].depth;

        //rout the examples stored in the node to the left and right
        for(size_t ec_id = 0; ec_id < b.nodes[cn].examples_index.size(); ec_id++) //scan all examples stored in the cn
        {
            uint32_t ec_pos = b.nodes[cn].examples_index[ec_id];
            MULTICLASS::label_t mc;
            uint32_t save_multi_pred = 0;
            MULTILABEL::labels multilabels;
            MULTILABEL::labels preds;
            if (b.oas == false){
                mc = b.examples[ec_pos]->l.multi;
                save_multi_pred = b.examples[ec_pos]->pred.multiclass;
            }
            else{
                multilabels = b.examples[ec_pos]->l.multilabels;
                preds = b.examples[ec_pos]->pred.multilabels;
            }

            b.examples[ec_pos]->l.simple = {1.f, 1.f, 0.f};
            base.predict(*b.examples[ec_pos], b.nodes[cn].base_router); //re-predict
            float scalar = b.examples[ec_pos]->pred.scalar; //this is spliting the leaf. 
            if (scalar < 0)
            {
                b.nodes[left_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], left_child);
                insert_descent(b.nodes[left_child], leaf_pred); //fake descent, only for update nl and nr                
            }
            else
            {
                b.nodes[right_child].examples_index.push_back(ec_pos);
                float leaf_pred = train_node(b, base, *b.examples[ec_pos], right_child);
                insert_descent(b.nodes[right_child], leaf_pred); //fake descent. for update nr and nl
            }

            if(b.oas == false){
                b.examples[ec_pos]->l.multi = mc;
                b.examples[ec_pos]->pred.multiclass = save_multi_pred;
            }
            else{
                b.examples[ec_pos]->pred.multilabels = preds;
                b.examples[ec_pos]->l.multilabels = multilabels;
            }
        }
        b.nodes[cn].examples_index.delete_v(); //empty the cn's example list
        b.nodes[cn].nl = (std::max)(double(b.nodes[left_child].examples_index.size()), 0.001); //avoid to set nl to zero
        b.nodes[cn].nr = (std::max)(double(b.nodes[right_child].examples_index.size()), 0.001); //avoid to set nr to zero

        if ((std::max)(b.nodes[cn].nl, b.nodes[cn].nr) > b.max_ex_in_leaf)
        {
            b.max_ex_in_leaf = (std::max)(b.nodes[cn].nl, b.nodes[cn].nr);
            //cout<<b.max_ex_in_leaf<<endl;
        }
    }